

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<double,int,double,duckdb::BinaryStandardOperatorWrapper,duckdb::RoundOperatorPrecision,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  bool bVar1;
  double *pdVar2;
  int *piVar3;
  double *left_00;
  undefined1 in_CL;
  Vector *in_RDX;
  Vector *in_RSI;
  double dVar4;
  bool in_stack_0000000f;
  double *result_data;
  int *rdata;
  double *ldata;
  ValidityMask *mask;
  undefined4 in_stack_ffffffffffffffc4;
  uint right_00;
  undefined1 fun_00;
  
  Vector::SetVectorType(in_RSI,(VectorType)((ulong)in_RDX >> 0x38));
  pdVar2 = ConstantVector::GetData<double>((Vector *)0x20b3774);
  piVar3 = ConstantVector::GetData<int>((Vector *)0x20b3783);
  fun_00 = (undefined1)((ulong)piVar3 >> 0x38);
  left_00 = ConstantVector::GetData<double>((Vector *)0x20b3792);
  bVar1 = ConstantVector::IsNull((Vector *)0x20b37a1);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0x20b37af), !bVar1)) {
    right_00 = CONCAT13(in_CL,(int3)in_stack_ffffffffffffffc4) & 0x1ffffff;
    mask = (ValidityMask *)*pdVar2;
    ConstantVector::Validity(in_RDX);
    dVar4 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::RoundOperatorPrecision,double,int,double>
                      ((bool)fun_00,(double)left_00,right_00,mask,0x20b380d);
    *left_00 = dVar4;
    return;
  }
  ConstantVector::SetNull((Vector *)result_data,in_stack_0000000f);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}